

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  secp256k1_fe *a_00;
  secp256k1_strauss_point_state *psVar1;
  undefined4 extraout_EAX;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  secp256k1_gej *psVar8;
  uint64_t *extraout_RDX;
  secp256k1_scalar *r_00;
  secp256k1_scalar *psVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  secp256k1_gej *r_01;
  uint64_t *puVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *r_02;
  secp256k1_ge *psVar15;
  uint count;
  secp256k1_gej *psVar16;
  bool bVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  int iStack_5c0;
  undefined1 auStack_5b0 [88];
  secp256k1_strauss_state *local_558;
  secp256k1_scalar *local_550;
  secp256k1_gej *local_548;
  uint64_t *local_540;
  secp256k1_gej *local_538;
  uint64_t local_530;
  long local_528;
  secp256k1_ge local_520;
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  secp256k1_scalar local_488;
  secp256k1_scalar local_468;
  secp256k1_scalar local_448 [16];
  secp256k1_gej local_238 [3];
  
  bVar18 = 0;
  local_4b8._0_8_ = 1;
  local_4b8._8_16_ = (undefined1  [16])0x0;
  local_4a0 = (undefined1  [16])0x0;
  local_490._0_4_ = 1;
  local_490._4_4_ = 1;
  auStack_5b0._80_8_ = 0x1504c3;
  psVar8 = a;
  local_540 = ng->d;
  local_538 = r;
  secp256k1_fe_verify((secp256k1_fe *)local_4b8);
  if (num == 0) {
    local_558 = (secp256k1_strauss_state *)0x0;
    psVar9 = (secp256k1_scalar *)0x0;
  }
  else {
    psVar9 = (secp256k1_scalar *)0x0;
    psVar16 = local_238;
    local_558 = (secp256k1_strauss_state *)0x0;
    do {
      auStack_5b0._80_8_ = 0x1504e6;
      secp256k1_scalar_verify(na);
      auVar19._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
      auVar19._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
      auVar19._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
      auVar19._12_4_ =
           -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
      iVar2 = movmskps(extraout_EAX,auVar19);
      if (iVar2 != 0xf) {
        auStack_5b0._80_8_ = 0x150513;
        secp256k1_gej_verify(a);
        if (a->infinity == 0) {
          auStack_5b0._80_8_ = 0x150536;
          secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)&local_520,na);
          lVar10 = (long)psVar9 * 0x410;
          auStack_5b0._80_8_ = 0x150560;
          local_550 = psVar9;
          iVar2 = secp256k1_ecmult_wnaf(state->ps[(long)psVar9].wnaf_na_1,0x81,local_448,5);
          r_02 = (secp256k1_gej *)state->ps[(long)psVar9].wnaf_na_lam;
          state->ps[(long)psVar9].bits_na_1 = iVar2;
          r_01 = (secp256k1_gej *)0x81;
          auStack_5b0._80_8_ = 0x150589;
          uVar3 = secp256k1_ecmult_wnaf((int *)r_02,0x81,(secp256k1_scalar *)&local_520,5);
          psVar1 = state->ps;
          psVar1[(long)psVar9].bits_na_lam = uVar3;
          uVar5 = psVar1[(long)psVar9].bits_na_1;
          if (0x81 < (int)uVar5) goto LAB_00150b48;
          if (0x81 < psVar1[(long)psVar9].bits_na_lam) goto LAB_00150b4d;
          if ((int)uVar5 <= (int)(uint)local_558) {
            uVar5 = (uint)local_558;
          }
          if ((int)uVar5 < (int)uVar3) {
            uVar5 = uVar3;
          }
          local_558 = (secp256k1_strauss_state *)(ulong)uVar5;
          auStack_5b0._80_8_ = 0x1505dd;
          memcpy(psVar16,a,0x98);
          psVar8 = (secp256k1_gej *)local_4b8;
          if (local_550 != (secp256k1_scalar *)0x0) {
            auStack_5b0._80_8_ = 0x1505fe;
            secp256k1_gej_rescale(psVar16,(secp256k1_fe *)psVar8);
          }
          psVar9 = local_550;
          auStack_5b0._80_8_ = 0x15062c;
          secp256k1_ecmult_odd_multiples_table
                    (8,state->pre_a + (long)local_550 * 8,state->aux + (long)local_550 * 8,
                     (secp256k1_fe *)psVar8,psVar16);
          if (psVar9 != (secp256k1_scalar *)0x0) {
            auStack_5b0._80_8_ = 0x150650;
            secp256k1_fe_mul(state->aux + (long)psVar9 * 8,state->aux + (long)psVar9 * 8,&a->z);
          }
          psVar9 = (secp256k1_scalar *)((long)psVar9->d + 1);
        }
      }
      a = a + 1;
      na = na + 1;
      num = (long)((secp256k1_scalar *)(num + -0x20))->d + 0x1f;
    } while ((secp256k1_scalar *)num != (secp256k1_scalar *)0x0);
  }
  local_550 = psVar9;
  if (psVar9 != (secp256k1_scalar *)0x0) {
    auStack_5b0._80_8_ = 0x150696;
    secp256k1_ge_table_set_globalz((long)psVar9 * 8,state->pre_a,state->aux);
    lVar10 = 0;
    psVar16 = (secp256k1_gej *)0x0;
    psVar9 = (secp256k1_scalar *)0x0;
    do {
      lVar11 = 0;
      local_548 = psVar16;
      do {
        auStack_5b0._80_8_ = 0x1506c4;
        secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar11 + lVar10),
                         (secp256k1_fe *)((long)(state->pre_a->x).n + (long)(psVar16->x).n),
                         &secp256k1_const_beta);
        psVar16 = (secp256k1_gej *)((psVar16->z).n + 1);
        lVar11 = lVar11 + 0x30;
      } while (lVar11 != 0x180);
      psVar9 = (secp256k1_scalar *)((long)psVar9->d + 1);
      psVar16 = (secp256k1_gej *)(local_548[5].y.n + 3);
      lVar10 = lVar10 + 0x180;
    } while (psVar9 != local_550);
  }
  if (local_540 == (uint64_t *)0x0) {
    local_528 = 0;
    local_530 = 0;
    uVar5 = (uint)local_558;
  }
  else {
    auStack_5b0._80_8_ = 0x150717;
    secp256k1_scalar_split_128(&local_468,&local_488,(secp256k1_scalar *)local_540);
    auStack_5b0._80_8_ = 0x150731;
    uVar3 = secp256k1_ecmult_wnaf((int *)local_238,0x81,&local_468,0xf);
    psVar8 = (secp256k1_gej *)0xf;
    auStack_5b0._80_8_ = 0x15074d;
    uVar4 = secp256k1_ecmult_wnaf((int *)local_448,0x81,&local_488,0xf);
    uVar5 = (uint)local_558;
    if ((int)(uint)local_558 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if ((int)uVar5 < (int)uVar4) {
      uVar5 = uVar4;
    }
    local_530 = (uint64_t)(int)uVar4;
    local_528 = (long)(int)uVar3;
  }
  r_02 = local_538;
  auStack_5b0._80_8_ = 0x15078f;
  secp256k1_gej_set_infinity(local_538);
  if (0 < (int)uVar5) {
    psVar16 = (secp256k1_gej *)(ulong)uVar5;
    local_540 = (uint64_t *)((long)psVar16 * 4 - 4);
    local_558 = state;
    do {
      auStack_5b0._80_8_ = 0x1507b7;
      secp256k1_gej_double_var(r_02,r_02,(secp256k1_fe *)0x0);
      local_548 = psVar16;
      r_01 = psVar16;
      if (local_550 != (secp256k1_scalar *)0x0) {
        psVar16 = (secp256k1_gej *)0x40c;
        a = (secp256k1_gej *)0x30;
        lVar10 = 0;
        num = (size_t)local_540;
        na = local_550;
        do {
          uVar5 = *(uint *)((long)&state->ps[-1].bits_na_lam + (long)psVar16);
          lVar11 = (long)(int)uVar5;
          if (((long)r_01 <= lVar11) &&
             (uVar3 = *(uint *)((long)state->ps->wnaf_na_1 + num), uVar3 != 0)) {
            if ((uVar3 & 1) == 0) {
              auStack_5b0._80_8_ = 0x150b2f;
              secp256k1_ecmult_strauss_wnaf_cold_5();
              uVar5 = (uint)lVar11;
LAB_00150b2f:
              auStack_5b0._80_8_ = 0x150b34;
              secp256k1_ecmult_strauss_wnaf_cold_8();
LAB_00150b34:
              auStack_5b0._80_8_ = 0x150b39;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_00150b39:
              auStack_5b0._80_8_ = 0x150b3e;
              secp256k1_ecmult_strauss_wnaf_cold_6();
            }
            else {
              if ((int)uVar3 < -0xf) goto LAB_00150b34;
              if ((int)uVar3 < 0x10) {
                if ((int)uVar3 < 1) {
                  puVar13 = (uint64_t *)((long)(a->x).n + (long)(&state->pre_a[~uVar3 >> 1].x + -1))
                  ;
                  psVar15 = &local_520;
                  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (psVar15->x).n[0] = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
                    psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar18 * -2 + 1) * 8);
                  }
                  a_00 = &local_520.y;
                  auStack_5b0._80_8_ = 0x150877;
                  secp256k1_fe_verify(a_00);
                  auStack_5b0._80_8_ = 0x150884;
                  secp256k1_fe_verify_magnitude(a_00,1);
                  local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                  local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                  local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                  local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                  local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                  local_520.y.magnitude = 2;
                  local_520.y.normalized = 0;
                  auStack_5b0._80_8_ = 0x1508e2;
                  secp256k1_fe_verify(a_00);
                  state = local_558;
                }
                else {
                  puVar13 = (uint64_t *)
                            ((long)(a->x).n + (long)(&state->pre_a[uVar3 - 1 >> 1].x + -1));
                  psVar15 = &local_520;
                  for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (psVar15->x).n[0] = *puVar13;
                    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
                    psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar18 * -2 + 1) * 8);
                  }
                }
                auStack_5b0._80_8_ = 0x1508fd;
                r_02 = local_538;
                secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
                r_01 = local_548;
                goto LAB_00150902;
              }
            }
            auStack_5b0._80_8_ = 0x150b43;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_00150b43:
            auStack_5b0._80_8_ = 0x150b48;
            secp256k1_ecmult_strauss_wnaf_cold_7();
            goto LAB_00150b48;
          }
LAB_00150902:
          uVar5 = *(uint *)((long)(psVar16->x).n + (long)state->ps->wnaf_na_1);
          psVar8 = (secp256k1_gej *)(long)(int)uVar5;
          if (((long)r_01 <= (long)psVar8) &&
             (uVar3 = *(uint *)((long)state->ps->wnaf_na_lam + num), uVar3 != 0)) {
            if ((uVar3 & 1) == 0) goto LAB_00150b2f;
            if ((int)uVar3 < -0xf) goto LAB_00150b39;
            if ((int)uVar3 < 0x10) {
              if ((int)uVar3 < 1) {
                auStack_5b0._80_8_ = 0x15099e;
                secp256k1_ge_set_xy(&local_520,
                                    (secp256k1_fe *)((long)state->aux[~uVar3 >> 1].n + lVar10),
                                    (secp256k1_fe *)
                                    ((long)(a->x).n + (long)(state->pre_a + (~uVar3 >> 1))));
                auStack_5b0._80_8_ = 0x1509a8;
                secp256k1_fe_verify(&local_520.y);
                auStack_5b0._80_8_ = 0x1509b7;
                secp256k1_fe_verify_magnitude(&local_520.y,1);
                local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                local_520.y.magnitude = 2;
                local_520.y.normalized = 0;
                auStack_5b0._80_8_ = 0x150a17;
                secp256k1_fe_verify(&local_520.y);
              }
              else {
                uVar5 = uVar3 - 1 >> 1;
                auStack_5b0._80_8_ = 0x150970;
                secp256k1_ge_set_xy(&local_520,(secp256k1_fe *)((long)state->aux[uVar5].n + lVar10),
                                    (secp256k1_fe *)((long)(a->x).n + (long)(state->pre_a + uVar5)))
                ;
              }
              psVar8 = (secp256k1_gej *)0x0;
              auStack_5b0._80_8_ = 0x150a29;
              r_02 = local_538;
              secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
              r_01 = local_548;
              state = local_558;
              goto LAB_00150a32;
            }
            goto LAB_00150b43;
          }
LAB_00150a32:
          num = num + 0x410;
          psVar16 = (secp256k1_gej *)(psVar16[6].z.n + 4);
          a = (secp256k1_gej *)(a[5].y.n + 3);
          lVar10 = lVar10 + 0x180;
          na = (secp256k1_scalar *)((long)na[-1].d + 0x1f);
        } while (na != (secp256k1_scalar *)0x0);
      }
      r_02 = local_538;
      psVar16 = (secp256k1_gej *)&r_01[-1].field_0x97;
      if (((long)r_01 <= local_528) &&
         (iVar2 = *(int *)((long)local_238[0].x.n + (long)psVar16 * 4), iVar2 != 0)) {
        auStack_5b0._80_8_ = 0x150a83;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g,iVar2,(int)psVar8);
        state = local_558;
        psVar8 = (secp256k1_gej *)local_4b8;
        auStack_5b0._80_8_ = 0x150a9d;
        secp256k1_gej_add_zinv_var(r_02,r_02,&local_520,(secp256k1_fe *)psVar8);
        r_01 = local_548;
      }
      if (((long)r_01 <= (long)local_530) &&
         (iVar2 = *(int *)((long)local_448[0].d + (long)psVar16 * 4), iVar2 != 0)) {
        auStack_5b0._80_8_ = 0x150ac8;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g_128,iVar2,(int)psVar8);
        state = local_558;
        psVar8 = (secp256k1_gej *)local_4b8;
        auStack_5b0._80_8_ = 0x150ae2;
        secp256k1_gej_add_zinv_var(r_02,r_02,&local_520,(secp256k1_fe *)psVar8);
        r_01 = local_548;
      }
      local_540 = (uint64_t *)((long)local_540 - 4);
    } while (1 < (long)r_01);
  }
  if (r_02->infinity == 0) {
    auStack_5b0._80_8_ = 0x150b18;
    secp256k1_fe_mul(&r_02->z,&r_02->z,(secp256k1_fe *)local_4b8);
  }
  return;
LAB_00150b48:
  auStack_5b0._80_8_ = 0x150b4d;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_00150b4d:
  auStack_5b0._80_8_ = secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  auStack_5b0._40_8_ = lVar10;
  auStack_5b0._48_8_ = na;
  auStack_5b0._56_8_ = a;
  auStack_5b0._64_8_ = state;
  auStack_5b0._72_8_ = psVar16;
  auStack_5b0._80_8_ = num;
  if (r_02 == (secp256k1_gej *)0x0) {
LAB_00150ceb:
    secp256k1_ecmult_wnaf_cold_5();
    psVar8 = r_02;
LAB_00150cf0:
    secp256k1_ecmult_wnaf_cold_4();
  }
  else {
    psVar8 = r_02;
    if (extraout_RDX == (uint64_t *)0x0) goto LAB_00150cf0;
    if (1 < (int)uVar5) {
      iVar2 = (int)r_01;
      uVar12 = (ulong)r_01 & 0xffffffff;
      if (0 < iVar2) {
        r_01 = (secp256k1_gej *)0x0;
        memset(r_02,0,uVar12 << 2);
      }
      auStack_5b0._0_8_ = *extraout_RDX;
      auStack_5b0._8_8_ = extraout_RDX[1];
      auStack_5b0._16_8_ = extraout_RDX[2];
      auStack_5b0._24_8_ = extraout_RDX[3];
      psVar8 = (secp256k1_gej *)auStack_5b0;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar8);
      iStack_5c0 = 1;
      if ((long)auStack_5b0._24_8_ < 0) {
        r_01 = (secp256k1_gej *)auStack_5b0;
        psVar8 = r_01;
        secp256k1_scalar_negate((secp256k1_scalar *)r_01,(secp256k1_scalar *)r_01);
        iStack_5c0 = -1;
      }
      if (iVar2 < 1) {
        bVar17 = true;
        psVar16 = (secp256k1_gej *)0x0;
      }
      else {
        uVar3 = 0;
        psVar14 = r_01;
        psVar16 = (secp256k1_gej *)0x0;
        do {
          r_01 = psVar16;
          psVar8 = (secp256k1_gej *)auStack_5b0;
          psVar16 = psVar8;
          secp256k1_scalar_verify((secp256k1_scalar *)psVar8);
          uVar4 = (uint)r_01;
          if (((*(ulong *)(auStack_5b0 + ((ulong)r_01 >> 6) * 8) >> ((ulong)r_01 & 0x3f) & 1) != 0)
              == uVar3) {
            uVar4 = uVar4 + 1;
            r_01 = psVar14;
            psVar8 = psVar16;
          }
          else {
            count = iVar2 - uVar4;
            if ((int)uVar5 <= (int)(iVar2 - uVar4)) {
              count = uVar5;
            }
            uVar6 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar8,uVar4,count);
            uVar7 = uVar6 + uVar3;
            bVar17 = (uVar7 >> (uVar5 - 1 & 0x1f) & 1) != 0;
            uVar3 = (uint)bVar17;
            *(uint *)((long)(r_02->x).n + (long)(int)uVar4 * 4) =
                 (uVar7 - ((uint)bVar17 << ((byte)uVar5 & 0x1f))) * iStack_5c0;
            uVar4 = count + uVar4;
          }
          psVar16 = (secp256k1_gej *)(ulong)uVar4;
          psVar14 = r_01;
        } while ((int)uVar4 < iVar2);
        bVar17 = uVar3 == 0;
      }
      if (bVar17) {
        if ((int)psVar16 < 0x100) {
          do {
            r_02 = (secp256k1_gej *)auStack_5b0;
            secp256k1_scalar_verify((secp256k1_scalar *)auStack_5b0);
            if ((*(ulong *)(auStack_5b0 + ((ulong)psVar16 >> 6) * 8) >> ((ulong)psVar16 & 0x3f) & 1)
                != 0) {
              secp256k1_ecmult_wnaf_cold_2();
              goto LAB_00150ceb;
            }
            uVar5 = (int)psVar16 + 1;
            psVar16 = (secp256k1_gej *)(ulong)uVar5;
          } while (uVar5 != 0x100);
        }
        return;
      }
      goto LAB_00150cfa;
    }
  }
  secp256k1_ecmult_wnaf_cold_3();
LAB_00150cfa:
  secp256k1_ecmult_wnaf_cold_1();
  secp256k1_scalar_verify(r_00);
  (psVar8->x).n[0] = r_00->d[0];
  (psVar8->x).n[1] = r_00->d[1];
  (psVar8->x).n[2] = 0;
  (psVar8->x).n[3] = 0;
  (r_01->x).n[0] = r_00->d[2];
  (r_01->x).n[1] = r_00->d[3];
  (r_01->x).n[2] = 0;
  (r_01->x).n[3] = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar8);
  secp256k1_scalar_verify((secp256k1_scalar *)r_01);
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}